

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsCalibration.cpp
# Opt level: O1

float deqp::gls::destructiveMedian<float>(vector<float,_std::allocator<float>_> *data)

{
  long lVar1;
  float *pfVar2;
  ulong uVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float fVar7;
  
  pfVar4 = (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  pfVar5 = (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  pfVar6 = (float *)(((long)pfVar5 - (long)pfVar4 >> 1 & 0xfffffffffffffffcU) + (long)pfVar4);
  if ((pfVar5 != pfVar4) && (pfVar6 != pfVar5)) {
    uVar3 = (long)pfVar5 - (long)pfVar4 >> 2;
    lVar1 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introselect<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pfVar4,pfVar6,pfVar5,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
  }
  pfVar4 = (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  fVar7 = *pfVar6;
  if ((*(int *)&(data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_finish - (int)pfVar4 & 4U) == 0) {
    pfVar5 = pfVar4 + 1;
    if (pfVar5 != pfVar6 && pfVar4 != pfVar6) {
      do {
        pfVar2 = pfVar5;
        if (*pfVar5 < *pfVar4 || *pfVar5 == *pfVar4) {
          pfVar2 = pfVar4;
        }
        pfVar4 = pfVar2;
        pfVar5 = pfVar5 + 1;
      } while (pfVar5 != pfVar6);
    }
    fVar7 = (fVar7 + *pfVar4) * 0.5;
  }
  return fVar7;
}

Assistant:

float destructiveMedian (vector<T>& data)
{
	const typename vector<T>::iterator mid = data.begin()+data.size()/2;

	std::nth_element(data.begin(), mid, data.end());

	if (data.size()%2 == 0) // Even number of elements, need average of two centermost elements
		return (*mid + *std::max_element(data.begin(), mid))*0.5f; // Data is partially sorted around mid, mid is half an item after center
	else
		return *mid;
}